

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

Image * __thiscall pbrt::Image::Crop(Image *this,Bounds2i *bounds,Allocator alloc)

{
  Point2i p_00;
  WrapMode2D wrapMode;
  Point2i p_01;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  Point2i resolution;
  bool bVar1;
  int iVar2;
  int iVar3;
  Vector2<int> VVar4;
  Bounds2iIterator *in_RCX;
  int *in_RDX;
  Image *this_00;
  int *in_RSI;
  undefined8 in_RDI;
  int c;
  Point2i p;
  Bounds2iIterator __end1;
  Bounds2iIterator __begin1;
  Bounds2i *__range1;
  int vb;
  int va;
  Image *image;
  ColorEncodingHandle *in_stack_fffffffffffffe78;
  Bounds2i *in_stack_fffffffffffffe80;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe88;
  Bounds2iIterator *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffec0;
  int iVar5;
  undefined4 in_stack_fffffffffffffec4;
  char (*in_stack_fffffffffffffec8) [2];
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  char *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  LogLevel level;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined8 in_stack_fffffffffffffef0;
  LogLevel level_00;
  undefined1 *puVar6;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  WrapMode WVar7;
  WrapMode WVar8;
  int iVar9;
  WrapMode WVar10;
  int iVar11;
  int local_ac;
  Bounds2iIterator local_80;
  ColorEncodingHandle *in_stack_ffffffffffffff90;
  Image *in_stack_ffffffffffffffa0;
  Allocator in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffb0 [12];
  int in_stack_ffffffffffffffc4;
  
  level = (LogLevel)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  level_00 = (LogLevel)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  WVar8 = (WrapMode)in_RDI;
  iVar9 = (int)((ulong)in_RDI >> 0x20);
  WVar10 = WVar8;
  iVar11 = iVar9;
  iVar2 = Bounds2<int>::Area(in_stack_fffffffffffffe80);
  if (iVar2 < 1) {
    LogFatal<char_const(&)[14],char_const(&)[2],char_const(&)[14],int&,char_const(&)[2],int&>
              (level_00,(char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),level,
               in_stack_fffffffffffffed8,
               (char (*) [14])CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8,
               (char (*) [14])CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (int *)CONCAT44(iVar9,WVar8),(char (*) [2])CONCAT44(iVar11,WVar10),in_RSI);
  }
  if ((-1 < *in_RDX) && (-1 < in_RDX[1])) {
    VVar4 = Point2<int>::operator-((Point2<int> *)in_stack_fffffffffffffe78,(Point2<int> *)0x4cf649)
    ;
    iVar2 = VVar4.super_Tuple2<pbrt::Vector2,_int>.x;
    iVar5 = VVar4.super_Tuple2<pbrt::Vector2,_int>.y;
    Point2<int>::Point2<int>
              (&in_stack_fffffffffffffe80->pMin,(Vector2<int> *)in_stack_fffffffffffffe78);
    pstd::span<std::__cxx11::string_const>::
    span<pbrt::InlinedVector<std::__cxx11::string,4,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>,void,pbrt::InlinedVector<std::__cxx11::string,4,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>>
              ((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    puVar6 = &stack0xffffffffffffffa0;
    ColorEncodingHandle::ColorEncodingHandle
              ((ColorEncodingHandle *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    resolution.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffffc4;
    resolution.super_Tuple2<pbrt::Point2,_int>.x = iVar5;
    channels.n._4_4_ = iVar2;
    channels._0_12_ = in_stack_ffffffffffffffb0;
    Image(in_stack_ffffffffffffffa0,(PixelFormat)((ulong)in_RCX >> 0x20),resolution,channels,
          in_stack_ffffffffffffff90,in_stack_ffffffffffffffa8);
    local_80 = pbrt::begin((Bounds2i *)0x4cf709);
    this_00 = (Image *)local_80.bounds;
    iVar2 = local_80.p.super_Tuple2<pbrt::Point2,_int>.x;
    WVar7 = local_80.p.super_Tuple2<pbrt::Point2,_int>.y;
    pbrt::end(in_stack_fffffffffffffe80);
    while( true ) {
      bVar1 = Bounds2iIterator::operator!=
                        (in_stack_fffffffffffffe90,(Bounds2iIterator *)in_stack_fffffffffffffe88);
      if (!bVar1) break;
      Bounds2iIterator::operator*(&local_80);
      local_ac = 0;
      while( true ) {
        iVar5 = local_ac;
        iVar3 = NChannels((Image *)0x4cf7da);
        if (iVar3 <= iVar5) break;
        Point2<int>::operator-(&in_RCX->p,(Point2<int> *)0x4cf805);
        Point2<int>::Point2<int>(&in_stack_fffffffffffffe80->pMin,(Vector2<int> *)in_RCX);
        WrapMode2D::WrapMode2D
                  ((WrapMode2D *)in_stack_fffffffffffffe90,
                   (WrapMode)((ulong)in_stack_fffffffffffffe88 >> 0x20));
        p_01.super_Tuple2<pbrt::Point2,_int>.y = WVar10;
        p_01.super_Tuple2<pbrt::Point2,_int>.x = iVar9;
        wrapMode.wrap.values[1] = WVar8;
        wrapMode.wrap.values[0] = WVar7;
        GetChannel(this_00,p_01,(int)((ulong)puVar6 >> 0x20),wrapMode);
        p_00.super_Tuple2<pbrt::Point2,_int>.y = WVar7;
        p_00.super_Tuple2<pbrt::Point2,_int>.x = iVar2;
        SetChannel(this_00,p_00,(int)((ulong)puVar6 >> 0x20),SUB84(puVar6,0));
        local_ac = local_ac + 1;
      }
      Bounds2iIterator::operator++(in_RCX);
    }
    return (Image *)CONCAT44(iVar11,WVar10);
  }
  LogFatal<char_const(&)[41]>
            (level,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,*in_stack_fffffffffffffec8,
             (char (*) [41])CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
}

Assistant:

Image Image::Crop(const Bounds2i &bounds, Allocator alloc) const {
    CHECK_GT(bounds.Area(), 0);
    CHECK(bounds.pMin.x >= 0 && bounds.pMin.y >= 0);
    Image image(format, Point2i(bounds.pMax - bounds.pMin), channelNames, encoding,
                alloc);
    for (Point2i p : bounds)
        for (int c = 0; c < NChannels(); ++c)
            image.SetChannel(Point2i(p - bounds.pMin), c, GetChannel(p, c));
    return image;
}